

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool qt_is_ascii(char **ptr,char *end)

{
  ulong uVar1;
  long lVar2;
  byte v;
  undefined1 auVar3 [16];
  uint v_00;
  uint uVar4;
  ulong in_RSI;
  ulong *in_RDI;
  long in_FS_OFFSET;
  uint idx_2;
  quint32 data_2;
  uint idx_1;
  quint8 mask_1;
  __m128i data_1;
  uint idx;
  quint32 mask;
  __m128i data;
  bool loops;
  size_t size;
  uint dest;
  bool local_71;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  while (*in_RDI + 0x10 <= in_RSI) {
    auVar3 = *(undefined1 (*) [16])*in_RDI;
    v_00 = (uint)(ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)((ulong)*(undefined8 *)(*(undefined1 (*) [16])*in_RDI + 8) >>
                                       0x3f) << 0xf);
    if (v_00 != 0) {
      uVar4 = qCountTrailingZeroBits(v_00);
      *in_RDI = *in_RDI + (ulong)uVar4;
      local_71 = false;
      goto LAB_001d0a22;
    }
    *in_RDI = *in_RDI + 0x10;
  }
  if (*in_RDI + 8 <= in_RSI) {
    uVar1 = *(ulong *)*in_RDI;
    v = (byte)(uVar1 >> 7) & 1 | ((byte)(uVar1 >> 0xf) & 1) << 1 | ((byte)(uVar1 >> 0x17) & 1) << 2
        | ((byte)(uVar1 >> 0x1f) & 1) << 3 | ((byte)(uVar1 >> 0x27) & 1) << 4 |
        ((byte)(uVar1 >> 0x2f) & 1) << 5 | ((byte)(uVar1 >> 0x37) & 1) << 6 |
        (byte)(uVar1 >> 0x38) & 0x80;
    if (v != 0) {
      uVar4 = qCountTrailingZeroBits(v);
      *in_RDI = *in_RDI + (ulong)uVar4;
      local_71 = false;
      goto LAB_001d0a22;
    }
    *in_RDI = *in_RDI + 8;
  }
  while (*in_RDI + 4 <= in_RSI) {
    if ((*(uint *)*in_RDI & 0x80808080) != 0) {
      uVar4 = qCountTrailingZeroBits(*(uint *)*in_RDI & 0x80808080);
      *in_RDI = *in_RDI + (ulong)(uVar4 >> 3);
      local_71 = false;
      goto LAB_001d0a22;
    }
    *in_RDI = *in_RDI + 4;
  }
  while (*in_RDI != in_RSI) {
    if ((*(byte *)*in_RDI & 0x80) != 0) {
      local_71 = false;
      goto LAB_001d0a22;
    }
    *in_RDI = *in_RDI + 1;
  }
  local_71 = true;
LAB_001d0a22:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_71;
  }
  __stack_chk_fail();
}

Assistant:

bool qt_is_ascii(const char *&ptr, const char *end) noexcept
{
#if defined(__SSE2__)
    // Testing for the high bit can be done efficiently with just PMOVMSKB
    bool loops = true;
    if constexpr (UseAvx2) {
        while (ptr + 32 <= end) {
            __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(ptr));
            quint32 mask = _mm256_movemask_epi8(data);
            if (mask) {
                uint idx = qCountTrailingZeroBits(mask);
                ptr += idx;
                return false;
            }
            ptr += 32;
        }
        loops = false;
    }

    while (ptr + 16 <= end) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
        quint32 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 16;

        if (!loops)
            break;
    }
    if (ptr + 8 <= end) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
        quint8 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 8;
    }
#endif

    while (ptr + 4 <= end) {
        quint32 data = qFromUnaligned<quint32>(ptr);
        if (data &= 0x80808080U) {
            uint idx = QSysInfo::ByteOrder == QSysInfo::BigEndian
                    ? qCountLeadingZeroBits(data)
                    : qCountTrailingZeroBits(data);
            ptr += idx / 8;
            return false;
        }
        ptr += 4;
    }

    while (ptr != end) {
        if (quint8(*ptr) & 0x80)
            return false;
        ++ptr;
    }
    return true;
}